

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.hpp
# Opt level: O3

size_t jessilib::
       value_end_action<char8_t,jessilib::HTMLFormContext<char8_t,std::vector<std::pair<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>,std::allocator<std::pair<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>>>>>
                 (HTMLFormContext<char8_t,_std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>_>
                  *inout_context,basic_string_view<char8_t,_std::char_traits<char8_t>_> *param_2)

{
  char8_t *pcVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> value;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> key;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_38;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_20;
  
  pcVar1 = inout_context->write_head;
  local_20._M_str = inout_context->key_start;
  local_38._M_str = inout_context->value_start;
  if (local_38._M_str == (char8_t *)0x0) {
    local_20._M_len = (long)pcVar1 - (long)local_20._M_str;
    local_38._M_len = 0;
    local_38._M_str = (char8_t *)0x0;
    container::
    push<std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_&,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_nullptr>
              (inout_context->out_container,&local_20,&local_38);
  }
  else {
    local_20._M_len = (long)local_38._M_str - (long)local_20._M_str;
    local_38._M_len = (long)pcVar1 - (long)local_38._M_str;
    container::
    push<std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_&,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_&,_nullptr>
              (inout_context->out_container,&local_20,&local_38);
    inout_context->value_start = (char8_t *)0x0;
  }
  inout_context->key_start = pcVar1;
  return 0;
}

Assistant:

constexpr size_t value_end_action(ContextT& inout_context, std::basic_string_view<CharT>&) {
	const CharT* value_end = inout_context.write_head;
	const CharT* key_start = inout_context.key_start;
	const CharT* value_start = inout_context.value_start;
	if (value_start != nullptr) {
		// Terminate key & value, push them to table
		std::basic_string_view<CharT> key{ key_start, static_cast<size_t>(value_start - key_start) };
		std::basic_string_view<CharT> value{ value_start, static_cast<size_t>(value_end - value_start) };
		jessilib::container::push(inout_context.out_container, key, value);

		// Start reading next key
		inout_context.key_start = value_end;
		inout_context.value_start = nullptr;
		return 0;
	}

	// This is a valueless key; terminate the key and push it
	std::basic_string_view<CharT> key{ key_start, static_cast<size_t>(value_end - key_start) };
	jessilib::container::push(inout_context.out_container, key, std::basic_string_view<CharT>{});

	// Start reading next key
	inout_context.key_start = value_end;
	return 0;
}